

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Char * Diligent::GetBufferModeString(BUFFER_MODE Mode)

{
  int iVar1;
  char *pcVar2;
  string msg;
  string local_30;
  
  if (GetBufferModeString(Diligent::BUFFER_MODE)::BuffModeToStr == '\0') {
    iVar1 = __cxa_guard_acquire(&GetBufferModeString(Diligent::BUFFER_MODE)::BuffModeToStr);
    if (iVar1 != 0) {
      GetBufferModeString::BuffModeToStr.BufferModeStrings._M_elems[0] = "BUFFER_MODE_UNDEFINED";
      GetBufferModeString::BuffModeToStr.BufferModeStrings._M_elems[1] = "BUFFER_MODE_FORMATTED";
      GetBufferModeString::BuffModeToStr.BufferModeStrings._M_elems[2] = "BUFFER_MODE_STRUCTURED";
      GetBufferModeString::BuffModeToStr.BufferModeStrings._M_elems[3] = "BUFFER_MODE_RAW";
      __cxa_guard_release(&GetBufferModeString(Diligent::BUFFER_MODE)::BuffModeToStr);
    }
  }
  if (Mode < BUFFER_MODE_NUM_MODES) {
    pcVar2 = GetBufferModeString::BuffModeToStr.BufferModeStrings._M_elems[Mode];
  }
  else {
    pcVar2 = "Unknown buffer mode";
    FormatString<char[20]>(&local_30,(char (*) [20])"Unknown buffer mode");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x525);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return pcVar2;
}

Assistant:

const Char* GetBufferModeString(BUFFER_MODE Mode)
{
    struct BufferModeToStringMap
    {
        BufferModeToStringMap()
        {
#define INIT_BUFF_MODE_STR(Mode) BufferModeStrings[Mode] = #Mode
            INIT_BUFF_MODE_STR(BUFFER_MODE_UNDEFINED);
            INIT_BUFF_MODE_STR(BUFFER_MODE_FORMATTED);
            INIT_BUFF_MODE_STR(BUFFER_MODE_STRUCTURED);
            INIT_BUFF_MODE_STR(BUFFER_MODE_RAW);
#undef INIT_BUFF_MODE_STR
            static_assert(BUFFER_MODE_NUM_MODES == 4, "Not all buffer mode strings initialized.");
        }

        const Char* operator[](BUFFER_MODE Mode) const
        {
            if (Mode >= BUFFER_MODE_UNDEFINED && Mode < BUFFER_MODE_NUM_MODES)
                return BufferModeStrings[Mode];
            else
            {
                UNEXPECTED("Unknown buffer mode");
                return "Unknown buffer mode";
            }
        }

    private:
        std::array<const Char*, BUFFER_MODE_NUM_MODES> BufferModeStrings{};
    };

    static const BufferModeToStringMap BuffModeToStr;
    return BuffModeToStr[Mode];
}